

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

void __thiscall cmSearchPath::AddCMakePrefixPath(cmSearchPath *this,string *variable)

{
  cmValue cVar1;
  string *psVar2;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  
  if (this->FC != (cmFindCommon *)0x0) {
    cVar1 = cmMakefile::GetDefinition(this->FC->Makefile,variable);
    if (cVar1.Value != (string *)0x0) {
      arg._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar1.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&local_20,arg,false);
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->FC->Makefile);
      AddPrefixPaths(this,&local_20,(psVar2->_M_dataplus)._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_20);
    }
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSearchPath.cxx"
                ,0x5e,"void cmSearchPath::AddCMakePrefixPath(const std::string &)");
}

Assistant:

void cmSearchPath::AddCMakePrefixPath(const std::string& variable)
{
  assert(this->FC != nullptr);

  // Get a path from a CMake variable.
  if (cmValue value = this->FC->Makefile->GetDefinition(variable)) {
    std::vector<std::string> expanded = cmExpandedList(*value);

    this->AddPrefixPaths(
      expanded, this->FC->Makefile->GetCurrentSourceDirectory().c_str());
  }
}